

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void wasm_module_imports(wasm_module_t *module,wasm_importtype_vec_t *out)

{
  FILE *__stream;
  ulong uVar1;
  vector<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_> *vec;
  Module *this;
  size_type sVar2;
  wasm_importtype_t *this_00;
  const_reference other;
  ImportType local_70;
  ulong local_28;
  size_t i;
  vector<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_> *import_types;
  wasm_importtype_vec_t *out_local;
  wasm_module_t *module_local;
  
  import_types = (vector<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_> *)out;
  out_local = (wasm_importtype_vec_t *)module;
  this = wasm_ref_t::As<wabt::interp::Module>(&module->super_wasm_ref_t);
  i = (size_t)wabt::interp::Module::import_types(this);
  __stream = _stderr;
  sVar2 = std::vector<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>::size
                    ((vector<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_> *)
                     i);
  fprintf(__stream,"CAPI: [%s] %zx\n","wasm_module_imports",sVar2);
  vec = import_types;
  sVar2 = std::vector<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>::size
                    ((vector<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_> *)
                     i);
  wasm_importtype_vec_new_uninitialized((wasm_importtype_vec_t *)vec,sVar2);
  local_28 = 0;
  while( true ) {
    uVar1 = local_28;
    sVar2 = std::vector<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>::size
                      ((vector<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>
                        *)i);
    if (sVar2 <= uVar1) break;
    this_00 = (wasm_importtype_t *)operator_new(0x70);
    other = std::vector<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>::
            operator[]((vector<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>
                        *)i,local_28);
    wabt::interp::ImportType::ImportType(&local_70,other);
    wasm_importtype_t::wasm_importtype_t(this_00,&local_70);
    *(wasm_importtype_t **)
     (&(((import_types->
         super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>).
         _M_impl.super__Vector_impl_data._M_finish)->module)._M_dataplus + local_28 * 8) = this_00;
    wabt::interp::ImportType::~ImportType(&local_70);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void wasm_module_imports(const wasm_module_t* module,
                         own wasm_importtype_vec_t* out) {
  auto&& import_types = module->As<Module>()->import_types();
  TRACE("%" PRIzx, import_types.size());
  wasm_importtype_vec_new_uninitialized(out, import_types.size());

  for (size_t i = 0; i < import_types.size(); ++i) {
    out->data[i] = new wasm_importtype_t{import_types[i]};
  }
}